

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O0

void single_channel_8_to_rgba_8888
               (void *src,int src_pitch,void *dst,int dst_pitch,int sx,int sy,int dx,int dy,
               int width,int height)

{
  uint32_t *puVar1;
  uint32_t *dst_end;
  int dst_gap;
  int src_gap;
  uint32_t *dst_ptr;
  uint8_t *src_ptr;
  int y;
  int sy_local;
  int sx_local;
  int dst_pitch_local;
  void *dst_local;
  int src_pitch_local;
  void *src_local;
  
  src_ptr = (uint8_t *)((long)src + (long)sx + (long)(sy * src_pitch));
  dst_ptr = (uint32_t *)((long)dst + (long)dx * 4 + (long)(dy * dst_pitch));
  for (y = 0; y < height; y = y + 1) {
    puVar1 = dst_ptr + width;
    for (; dst_ptr < puVar1; dst_ptr = dst_ptr + 1) {
      *dst_ptr = (uint)*src_ptr << 0x18 | 0xff;
      src_ptr = src_ptr + 1;
    }
    src_ptr = src_ptr + (src_pitch / 1 - width);
    dst_ptr = dst_ptr + (dst_pitch / 4 - width);
  }
  return;
}

Assistant:

static void single_channel_8_to_rgba_8888(const void *src, int src_pitch,
   void *dst, int dst_pitch,
   int sx, int sy, int dx, int dy, int width, int height)
{
   int y;
   const uint8_t *src_ptr = (const uint8_t *)((const char *)src + sy * src_pitch);
   uint32_t *dst_ptr = (void *)((char *)dst + dy * dst_pitch);
   int src_gap = src_pitch / 1 - width;
   int dst_gap = dst_pitch / 4 - width;
   src_ptr += sx;
   dst_ptr += dx;
   for (y = 0; y < height; y++) {
      uint32_t *dst_end = dst_ptr + width;
      while (dst_ptr < dst_end) {
         *dst_ptr = ALLEGRO_CONVERT_SINGLE_CHANNEL_8_TO_RGBA_8888(*src_ptr);
         dst_ptr++;
         src_ptr++;
      }
      src_ptr += src_gap;
      dst_ptr += dst_gap;
   }
}